

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O3

void __thiscall
spdlog::details::circular_q<spdlog::details::log_msg_buffer>::copy_moveable
          (circular_q<spdlog::details::log_msg_buffer> *this,
          circular_q<spdlog::details::log_msg_buffer> *other)

{
  size_type sVar1;
  size_t sVar2;
  pointer plVar3;
  vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_> local_28
  ;
  
  sVar1 = other->head_;
  this->max_items_ = other->max_items_;
  this->head_ = sVar1;
  sVar2 = other->overrun_counter_;
  this->tail_ = other->tail_;
  this->overrun_counter_ = sVar2;
  local_28.
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->v_).
       super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  plVar3 = (other->v_).
           super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->v_).
       super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->v_).
       super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->v_).
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (other->v_).
       super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->v_).
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_finish = plVar3;
  (this->v_).
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->v_).
       super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->v_).
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (other->v_).
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (other->v_).
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
  ~vector(&local_28);
  other->tail_ = 0;
  other->overrun_counter_ = 0;
  other->max_items_ = 0;
  other->head_ = 0;
  return;
}

Assistant:

void copy_moveable(circular_q &&other) SPDLOG_NOEXCEPT {
        max_items_ = other.max_items_;
        head_ = other.head_;
        tail_ = other.tail_;
        overrun_counter_ = other.overrun_counter_;
        v_ = std::move(other.v_);

        // put &&other in disabled, but valid state
        other.max_items_ = 0;
        other.head_ = other.tail_ = 0;
        other.overrun_counter_ = 0;
    }